

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O0

Vec_Ptr_t * Fra_SmlSortUsingOnes(Fra_Sml_t *p,int fLatchCorr)

{
  int iVar1;
  int iVar2;
  int *__ptr;
  void *__s;
  Aig_Obj_t *pAVar3;
  Vec_Ptr_t *p_00;
  void *pvVar4;
  void *local_50;
  int *pMemory;
  int *pnBits;
  int *pnNodes;
  int nBits;
  int nTotal;
  int nNodes;
  int i;
  Vec_Ptr_t *vNodes;
  Aig_Obj_t *pObj;
  int fLatchCorr_local;
  Fra_Sml_t *p_local;
  
  if (p->nWordsTotal < 1) {
    __assert_fail("p->nWordsTotal > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraImp.c"
                  ,0x9f,"Vec_Ptr_t *Fra_SmlSortUsingOnes(Fra_Sml_t *, int)");
  }
  __ptr = Fra_SmlCountOnes(p);
  nBits = 0;
  iVar1 = p->nWordsTotal * 0x20;
  __s = malloc((long)(iVar1 + 1) << 2);
  memset(__s,0,(long)(iVar1 + 1) << 2);
  for (nTotal = 0; iVar2 = Vec_PtrSize(p->pAig->vObjs), nTotal < iVar2; nTotal = nTotal + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,nTotal);
    if ((pAVar3 != (Aig_Obj_t *)0x0) && (nTotal != 0)) {
      if (fLatchCorr == 0) {
        iVar2 = Aig_ObjIsNode(pAVar3);
        if (iVar2 == 0) {
          iVar2 = Aig_ObjIsCi(pAVar3);
          goto joined_r0x00859d05;
        }
      }
      else {
        iVar2 = Aig_ObjIsCi(pAVar3);
joined_r0x00859d05:
        if (iVar2 == 0) goto LAB_00859d60;
      }
      if (iVar1 < __ptr[nTotal]) {
        __assert_fail("pnBits[i] <= nBits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraImp.c"
                      ,0xb8,"Vec_Ptr_t *Fra_SmlSortUsingOnes(Fra_Sml_t *, int)");
      }
      *(int *)((long)__s + (long)__ptr[nTotal] * 4) =
           *(int *)((long)__s + (long)__ptr[nTotal] * 4) + 1;
      nBits = nBits + 1;
    }
LAB_00859d60:
  }
  local_50 = malloc((long)(nBits + iVar1 + 1) << 2);
  p_00 = Vec_PtrAlloc(iVar1 + 1);
  Vec_PtrPush(p_00,local_50);
  for (nTotal = 1; nTotal <= iVar1; nTotal = nTotal + 1) {
    local_50 = (void *)((long)local_50 +
                       (long)(*(int *)((long)__s + (long)(nTotal + -1) * 4) + 1) * 4);
    Vec_PtrPush(p_00,local_50);
  }
  memset(__s,0,(long)(iVar1 + 1) << 2);
  nTotal = 0;
  do {
    iVar2 = Vec_PtrSize(p->pAig->vObjs);
    if (iVar2 <= nTotal) {
      pnNodes._4_4_ = 0;
      for (nTotal = 0; iVar2 = Vec_PtrSize(p_00), nTotal < iVar2; nTotal = nTotal + 1) {
        pvVar4 = Vec_PtrEntry(p_00,nTotal);
        iVar2 = *(int *)((long)__s + (long)nTotal * 4);
        *(int *)((long)__s + (long)nTotal * 4) = iVar2 + 1;
        *(undefined4 *)((long)pvVar4 + (long)iVar2 * 4) = 0;
        pnNodes._4_4_ = *(int *)((long)__s + (long)nTotal * 4) + pnNodes._4_4_;
      }
      if (pnNodes._4_4_ != nBits + iVar1 + 1) {
        __assert_fail("nTotal == nNodes + nBits + 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraImp.c"
                      ,0xe3,"Vec_Ptr_t *Fra_SmlSortUsingOnes(Fra_Sml_t *, int)");
      }
      if (__s != (void *)0x0) {
        free(__s);
      }
      if (__ptr != (int *)0x0) {
        free(__ptr);
      }
      return p_00;
    }
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,nTotal);
    if ((pAVar3 != (Aig_Obj_t *)0x0) && (nTotal != 0)) {
      if (fLatchCorr == 0) {
        iVar2 = Aig_ObjIsNode(pAVar3);
        if (iVar2 == 0) {
          iVar2 = Aig_ObjIsCi(pAVar3);
          goto joined_r0x00859ea0;
        }
      }
      else {
        iVar2 = Aig_ObjIsCi(pAVar3);
joined_r0x00859ea0:
        if (iVar2 == 0) goto LAB_00859eeb;
      }
      pvVar4 = Vec_PtrEntry(p_00,__ptr[nTotal]);
      iVar2 = *(int *)((long)__s + (long)__ptr[nTotal] * 4);
      *(int *)((long)__s + (long)__ptr[nTotal] * 4) = iVar2 + 1;
      *(int *)((long)pvVar4 + (long)iVar2 * 4) = nTotal;
    }
LAB_00859eeb:
    nTotal = nTotal + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Fra_SmlSortUsingOnes( Fra_Sml_t * p, int fLatchCorr )
{
    Aig_Obj_t * pObj;
    Vec_Ptr_t * vNodes;
    int i, nNodes, nTotal, nBits, * pnNodes, * pnBits, * pMemory;
    assert( p->nWordsTotal > 0 );
    // count 1s in each node's siminfo
    pnBits = Fra_SmlCountOnes( p );
    // count number of nodes having that many 1s
    nNodes = 0;
    nBits = p->nWordsTotal * 32;
    pnNodes = ABC_ALLOC( int, nBits + 1 );
    memset( pnNodes, 0, sizeof(int) * (nBits + 1) );
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( i == 0 ) continue;
        // skip non-PI and non-internal nodes
        if ( fLatchCorr )
        {
            if ( !Aig_ObjIsCi(pObj) )
                continue;
        }
        else
        {
            if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
                continue;
        }
        // skip nodes participating in the classes
//        if ( Fra_ClassObjRepr(pObj) )
//            continue;
        assert( pnBits[i] <= nBits ); // "<" because of normalized info
        pnNodes[pnBits[i]]++;
        nNodes++;
    }
    // allocate memory for all the nodes
    pMemory = ABC_ALLOC( int, nNodes + nBits + 1 );  
    // markup the memory for each node
    vNodes = Vec_PtrAlloc( nBits + 1 );
    Vec_PtrPush( vNodes, pMemory );
    for ( i = 1; i <= nBits; i++ )
    {
        pMemory += pnNodes[i-1] + 1;
        Vec_PtrPush( vNodes, pMemory );
    }
    // add the nodes
    memset( pnNodes, 0, sizeof(int) * (nBits + 1) );
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( i == 0 ) continue;
        // skip non-PI and non-internal nodes
        if ( fLatchCorr )
        {
            if ( !Aig_ObjIsCi(pObj) )
                continue;
        }
        else
        {
            if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
                continue;
        }
        // skip nodes participating in the classes
//        if ( Fra_ClassObjRepr(pObj) )
//            continue;
        pMemory = (int *)Vec_PtrEntry( vNodes, pnBits[i] );
        pMemory[ pnNodes[pnBits[i]]++ ] = i;
    }
    // add 0s in the end
    nTotal = 0;
    Vec_PtrForEachEntry( int *, vNodes, pMemory, i )
    {
        pMemory[ pnNodes[i]++ ] = 0;
        nTotal += pnNodes[i];
    }
    assert( nTotal == nNodes + nBits + 1 );
    ABC_FREE( pnNodes );
    ABC_FREE( pnBits );
    return vNodes;
}